

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::Structure::Member,_8UL>::clear
          (ArrayWithPreallocation<soul::Structure::Member,_8UL> *this)

{
  Category *pCVar1;
  Member *pMVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->numActive != 0) {
    lVar4 = 0x28;
    uVar5 = 0;
    do {
      pMVar2 = this->items;
      pCVar1 = &(pMVar2->type).category + lVar4;
      plVar3 = *(long **)((long)pMVar2 + lVar4 + -0x10);
      if (pCVar1 != (Category *)plVar3) {
        operator_delete(plVar3,*(long *)pCVar1 + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(*(Structure **)((long)pMVar2 + lVar4 + -0x18));
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < this->numActive);
  }
  this->numActive = 0;
  if (8 < this->numAllocated) {
    if (this->items != (Member *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (Member *)this->space;
    this->numAllocated = 8;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }